

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

char * __thiscall
google::protobuf::internal::ParseContext::ParseGroup
          (ParseContext *this,MessageLite *msg,char *ptr,uint32_t tag)

{
  int v1;
  undefined4 uVar1;
  undefined4 uVar2;
  uint32_t uVar3;
  char *pcVar4;
  string *psVar5;
  char *pcVar6;
  size_type sVar7;
  undefined8 uVar8;
  int iVar9;
  pointer pcVar10;
  LogMessageFatal aLStack_38 [16];
  
  iVar9 = this->depth_;
  v1 = iVar9 + -1;
  this->depth_ = v1;
  if (iVar9 < 1) {
    pcVar6 = (char *)0x0;
  }
  else {
    iVar9 = this->group_depth_ + 1;
    this->group_depth_ = iVar9;
    pcVar4 = MessageLite::_InternalParse(msg,ptr,this);
    if (pcVar4 != (char *)0x0) {
      psVar5 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                         (v1,this->depth_,"old_depth == depth_");
      if (psVar5 != (string *)0x0) {
        pcVar10 = (psVar5->_M_dataplus)._M_p;
        sVar7 = psVar5->_M_string_length;
        uVar8 = 0x217;
LAB_0023a3b1:
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (aLStack_38,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                   ,uVar8,sVar7,pcVar10);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_38);
      }
      psVar5 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                         (iVar9,this->group_depth_,"old_group_depth == group_depth_");
      if (psVar5 != (string *)0x0) {
        pcVar10 = (psVar5->_M_dataplus)._M_p;
        sVar7 = psVar5->_M_string_length;
        uVar8 = 0x218;
        goto LAB_0023a3b1;
      }
    }
    uVar1 = this->depth_;
    uVar2 = this->group_depth_;
    this->depth_ = uVar1 + 1;
    this->group_depth_ = uVar2 + -1;
    uVar3 = (this->super_EpsCopyInputStream).last_tag_minus_1_;
    (this->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    pcVar6 = (char *)0x0;
    if (uVar3 == tag) {
      pcVar6 = pcVar4;
    }
  }
  return pcVar6;
}

Assistant:

PROTOBUF_NODISCARD PROTOBUF_NDEBUG_INLINE const char* ParseGroup(
      MessageLite* msg, const char* ptr, uint32_t tag) {
    if (--depth_ < 0) return nullptr;
    group_depth_++;
    auto old_depth = depth_;
    auto old_group_depth = group_depth_;
    ptr = msg->_InternalParse(ptr, this);
    if (ptr != nullptr) {
      ABSL_DCHECK_EQ(old_depth, depth_);
      ABSL_DCHECK_EQ(old_group_depth, group_depth_);
    }
    group_depth_--;
    depth_++;
    if (PROTOBUF_PREDICT_FALSE(!ConsumeEndGroup(tag))) return nullptr;
    return ptr;
  }